

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O2

void recff_xpairs(jit_State *J,RecordFFData *rd)

{
  uint uVar1;
  uint uVar2;
  TRef TVar3;
  TRef *pTVar4;
  
  uVar1 = *J->base;
  uVar2 = uVar1 & 0x1f000000;
  if (uVar2 == 0xb000000) {
    TVar3 = lj_ir_kgc(J,(GCobj *)(ulong)(J->fn->c).upvalue[0].u32.lo,IRT_FUNC);
    pTVar4 = J->base;
    *pTVar4 = TVar3;
    pTVar4[1] = uVar1;
    if (rd->data == 0) {
      TVar3 = 0x7fff;
    }
    else {
      TVar3 = lj_ir_kint(J,0);
      pTVar4 = J->base;
    }
    pTVar4[2] = TVar3;
    rd->nres = 3;
  }
  else if (uVar2 == 0xa000000) {
    recff_metacall(J,rd,rd->data + MM_pairs);
    return;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_xpairs(jit_State *J, RecordFFData *rd)
{
  TRef tr = J->base[0];
  if (!((LJ_52 || (LJ_HASFFI && tref_iscdata(tr))) &&
	recff_metacall(J, rd, MM_pairs + rd->data))) {
    if (tref_istab(tr)) {
      J->base[0] = lj_ir_kfunc(J, funcV(&J->fn->c.upvalue[0]));
      J->base[1] = tr;
      J->base[2] = rd->data ? lj_ir_kint(J, 0) : TREF_NIL;
      rd->nres = 3;
    }  /* else: Interpreter will throw. */
  }
}